

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SetAssetIssuanceTest1_Test::TestBody
          (ConfidentialTransactionContext_SetAssetIssuanceTest1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  IssuanceOutputParameter token_output;
  IssuanceOutputParameter issue_output;
  IssuanceParameter param;
  bool is_blind;
  ByteData256 contract_hash;
  Address token_address;
  Address asset_address;
  Amount token_amount;
  Amount asset_amount;
  Txid txid;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  IssuanceParameter *pIVar3;
  uint in_stack_fffffffffffff020;
  undefined4 in_stack_fffffffffffff024;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff030;
  IssuanceOutputParameter *in_stack_fffffffffffff040;
  AssertHelper local_f58;
  Message local_f50;
  string local_f48 [32];
  AssertionResult local_f28;
  AssertHelper local_f18;
  Message local_f10;
  string local_f08 [32];
  string local_ee8 [32];
  AssertionResult local_ec8;
  AssertHelper local_eb8;
  Message local_eb0 [2];
  undefined1 local_ea0 [152];
  IssuanceParameter local_e08 [7];
  undefined8 local_aa8;
  undefined1 local_aa0;
  IssuanceOutputParameter local_a90;
  byte local_6a1;
  ByteData256 local_6a0;
  vector local_688 [31];
  allocator local_669;
  string local_668 [32];
  Address local_648 [376];
  vector local_4d0 [31];
  allocator local_4b1;
  string local_4b0 [32];
  Address local_490 [376];
  undefined8 local_318;
  undefined1 local_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  undefined1 local_2f0;
  Amount local_2e8 [23];
  allocator local_2d1;
  string local_2d0 [32];
  Txid local_2b0;
  ConfidentialTransactionContext local_290 [191];
  allocator local_1d1;
  string local_1d0 [32];
  ConfidentialTransactionContext local_1b0 [207];
  allocator local_e1;
  string local_e0 [32];
  ConfidentialTransactionContext local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_1b0,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_290,local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,"c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",&local_2d1
            );
  cfd::core::Txid::Txid(&local_2b0,local_2d0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_2f8 = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_2f0 = extraout_DL;
  local_2e8._0_8_ = local_2f8;
  local_2e8[8] = (Amount)extraout_DL;
  local_318 = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_310 = extraout_DL_00;
  local_308 = local_318;
  local_300 = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",&local_4b1);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_490,local_4b0,local_4d0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff030);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG",&local_669);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_648,local_668,local_688);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff030);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  cfd::core::ByteData256::ByteData256(&local_6a0);
  local_6a1 = 0;
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffff040);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(in_stack_fffffffffffff040);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(in_stack_fffffffffffff040);
  cfd::core::Address::operator=(&local_a90.address,local_490);
  local_a90._872_1_ = local_2e8[8];
  local_a90.amount = local_2e8[0];
  local_a90._865_1_ = local_2e8[1];
  local_a90._866_1_ = local_2e8[2];
  local_a90._867_1_ = local_2e8[3];
  local_a90._868_1_ = local_2e8[4];
  local_a90._869_1_ = local_2e8[5];
  local_a90._870_1_ = local_2e8[6];
  local_a90._871_1_ = local_2e8[7];
  cfd::core::Address::operator=((Address *)local_e08,local_648);
  local_aa0 = local_300;
  local_aa8 = local_308;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_ea0,&local_2b0,1);
      in_stack_fffffffffffff020 = local_6a1 & 1;
      pIVar3 = local_e08;
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                ((OutPoint *)(local_ea0 + 0x28),(Amount *)local_290,
                 (IssuanceOutputParameter *)local_ea0,local_2e8,&local_a90,SUB81(&local_308,0),
                 (ByteData256 *)pIVar3);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
                 pIVar3);
      cfd::core::IssuanceParameter::~IssuanceParameter
                ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020))
      ;
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1d6316);
    }
  }
  else {
    testing::Message::Message(local_eb0);
    testing::internal::AssertHelper::AssertHelper
              (&local_eb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xaa,
               "Expected: (param = tx.SetAssetIssuance(OutPoint(txid, 1), asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_eb8,local_eb0);
    testing::internal::AssertHelper::~AssertHelper(&local_eb8);
    testing::Message::~Message((Message *)0x1d6668);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ec8,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string(local_f08);
  std::__cxx11::string::~string(local_ee8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ec8);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d67df);
    testing::internal::AssertHelper::AssertHelper
              (&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f18,&local_f10);
    testing::internal::AssertHelper::~AssertHelper(&local_f18);
    testing::Message::~Message((Message *)0x1d683c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6894);
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f28,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",pcVar2,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string(local_f48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f28);
  if (!bVar1) {
    testing::Message::Message(&local_f50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d697b);
    testing::internal::AssertHelper::AssertHelper
              (&local_f58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f58,&local_f50);
    testing::internal::AssertHelper::~AssertHelper(&local_f58);
    testing::Message::~Message((Message *)0x1d69d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6a30);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::core::IssuanceParameter::~IssuanceParameter
            ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1d6a64);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::core::Txid::~Txid((Txid *)0x1d6a8b);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetIssuanceTest1)
{
    ConfidentialTransactionContext tx_base(
        "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
    ConfidentialTransactionContext expect_tx(
        "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f");
    Amount asset_amount = Amount::CreateByCoinAmount(100.0);
    Amount token_amount = Amount::CreateByCoinAmount(10.0);
    Address asset_address("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z", cfd::core::GetElementsAddressFormatList());
    Address token_address("2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG", cfd::core::GetElementsAddressFormatList());
    ByteData256 contract_hash;
    bool is_blind = false;
    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    IssuanceOutputParameter token_output;
    issue_output.address = asset_address;
    issue_output.amount = asset_amount;
    token_output.address = token_address;
    token_output.amount = token_amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetIssuance(OutPoint(txid, 1), asset_amount,
                                     issue_output, token_amount,
                                     token_output, is_blind,
                                     contract_hash)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
    EXPECT_STREQ(
        param.entropy.GetHex().c_str(),
        "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
}